

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O0

bool __thiscall
cmVariableWatch::AddWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data,
          DeleteData delete_data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  element_type *peVar3;
  mapped_type *this_00;
  __shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  shared_ptr<cmVariableWatch::Pair> *pair;
  iterator __end1;
  iterator __begin1;
  VectorOfPairs *__range1;
  VectorOfPairs *vp;
  shared_ptr<cmVariableWatch::Pair> p;
  DeleteData delete_data_local;
  void *client_data_local;
  WatchMethod method_local;
  string *variable_local;
  cmVariableWatch *this_local;
  
  p.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)delete_data;
  std::make_shared<cmVariableWatch::Pair>();
  peVar3 = std::__shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&vp);
  peVar3->Method = method;
  peVar3 = std::__shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&vp);
  _Var1 = p.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  peVar3->ClientData = client_data;
  peVar3 = std::__shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&vp);
  peVar3->DeleteDataCall = (DeleteData)_Var1._M_pi;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>_>
            ::operator[](&this->WatchMap,variable);
  __end1 = std::
           vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>
           ::begin(this_00);
  pair = (shared_ptr<cmVariableWatch::Pair> *)
         std::
         vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>
         ::end(this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<cmVariableWatch::Pair>_*,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>
                                *)&pair);
    if (!bVar2) {
      std::
      vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>
      ::push_back(this_00,(value_type *)&vp);
      this_local._7_1_ = true;
LAB_00270320:
      std::shared_ptr<cmVariableWatch::Pair>::~shared_ptr((shared_ptr<cmVariableWatch::Pair> *)&vp);
      return this_local._7_1_;
    }
    this_01 = (__shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<cmVariableWatch::Pair>_*,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>
                 ::operator*(&__end1);
    peVar3 = std::
             __shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    if ((peVar3->Method == method) && (client_data != (void *)0x0)) {
      peVar3 = std::
               __shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_01);
      if (client_data == peVar3->ClientData) {
        this_local._7_1_ = false;
        goto LAB_00270320;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<cmVariableWatch::Pair>_*,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool cmVariableWatch::AddWatch(const std::string& variable, WatchMethod method,
                               void* client_data /*=0*/,
                               DeleteData delete_data /*=0*/)
{
  auto p = std::make_shared<cmVariableWatch::Pair>();
  p->Method = method;
  p->ClientData = client_data;
  p->DeleteDataCall = delete_data;
  cmVariableWatch::VectorOfPairs& vp = this->WatchMap[variable];
  for (auto& pair : vp) {
    if (pair->Method == method && client_data &&
        client_data == pair->ClientData) {
      // Callback already exists
      return false;
    }
  }
  vp.push_back(std::move(p));
  return true;
}